

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  char *pcVar1;
  undefined8 extraout_RAX;
  String local_20;
  
  this->_vptr_DeathTest = (_func_int **)&PTR__DeathTest_001b4b88;
  UnitTest::GetInstance();
  if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ != (TestInfo *)0x0) {
    return;
  }
  pcVar1 = (char *)operator_new__(0x3e);
  builtin_strncpy(pcVar1,"Cannot run a death test outside of a TEST or TEST_F construct",0x3e);
  local_20.length_ = 0x3d;
  local_20.c_str_ = pcVar1;
  DeathTestAbort(&local_20);
  operator_delete__(pcVar1);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == NULL) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}